

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_move_to_last(ImGuiInputTextState *str,STB_TexteditState *state)

{
  ImGuiInputTextState *in_RSI;
  STB_TexteditState *in_stack_ffffffffffffffe8;
  
  if (in_RSI->CurLenW != in_RSI->CurLenA) {
    stb_textedit_sortselection((STB_TexteditState *)in_RSI);
    stb_textedit_clamp(in_RSI,in_stack_ffffffffffffffe8);
    in_RSI->ID = in_RSI->CurLenA;
    in_RSI->CurLenW = in_RSI->CurLenA;
    in_RSI->field_0xf = 0;
  }
  return;
}

Assistant:

static void stb_textedit_move_to_last(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   if (STB_TEXT_HAS_SELECTION(state)) {
      stb_textedit_sortselection(state);
      stb_textedit_clamp(str, state);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
      state->has_preferred_x = 0;
   }
}